

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  FILE *__stream;
  reference r;
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined8 uVar5;
  string local_260 [39];
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  reference local_198;
  EdgeList *nl;
  undefined1 local_188 [4];
  uint i;
  ostringstream e;
  cmComputeLinkDepends *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  nl._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)nl._4_4_;
    sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                      (&(this->EntryConstraintGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
    __stream = _stderr;
    if (sVar2 <= uVar1) break;
    local_198 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                          (&(this->EntryConstraintGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                           (ulong)nl._4_4_);
    poVar3 = std::operator<<((ostream *)local_188,"item ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,nl._4_4_);
    poVar3 = std::operator<<(poVar3," is [");
    pvVar4 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(ulong)nl._4_4_);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    std::operator<<(poVar3,"]\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"  item ",&local_1e9);
    r = local_198;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210," must follow it",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"\n",&local_239);
    cmWrap<cmGraphEdgeList>(&local_1c8,&local_1e8,r,&local_210,&local_238);
    poVar3 = std::operator<<((ostream *)local_188,(string *)&local_1c8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    nl._4_4_ = nl._4_4_ + 1;
  }
  std::__cxx11::ostringstream::str();
  uVar5 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar5);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}